

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkAddBuffsInt(Abc_Ntk_t *pNtkInit,int fReverse,int nImprove,int fVerbose)

{
  uint nLevelMax_00;
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pFaninNew;
  int local_84;
  uint local_80;
  int CountGain_1;
  int TotalGain_1;
  int Counter_1;
  Vec_Ptr_t *vNodes_1;
  uint local_68;
  int CountGain;
  int TotalGain;
  int Counter;
  Vec_Ptr_t *vNodes;
  int nLevelMax;
  int Iter;
  int k;
  int i;
  Abc_Obj_t *pBuffer;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vBuffs;
  int fVerbose_local;
  int nImprove_local;
  int fReverse_local;
  Abc_Ntk_t *pNtkInit_local;
  
  pNtk_00 = Abc_NtkDup(pNtkInit);
  nLevelMax_00 = Abc_NtkLevel(pNtk_00);
  for (Iter = 0; iVar1 = Abc_NtkCoNum(pNtk_00), Iter < iVar1; Iter = Iter + 1) {
    pAVar3 = Abc_NtkCo(pNtk_00,Iter);
    *(uint *)&pAVar3->field_0x14 =
         *(uint *)&pAVar3->field_0x14 & 0xfff | (nLevelMax_00 + 1) * 0x1000;
  }
  if (fReverse == 0) {
    pVVar4 = Abc_NtkDfs(pNtk_00,1);
    for (vNodes._4_4_ = 0; vNodes._4_4_ < nImprove; vNodes._4_4_ = vNodes._4_4_ + 1) {
      CountGain_1 = 0;
      local_80 = 0;
      Iter = Vec_PtrSize(pVVar4);
      while (Iter = Iter + -1, -1 < Iter) {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pVVar4,Iter);
        local_84 = 1;
        if (nLevelMax_00 < *(uint *)&pAVar3->field_0x14 >> 0xc) {
          __assert_fail("pObj->Level <= (unsigned)nLevelMax",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                        ,0x94e,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
        }
        for (nLevelMax = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), nLevelMax < iVar1;
            nLevelMax = nLevelMax + 1) {
          pAVar5 = Abc_ObjFanout(pAVar3,nLevelMax);
          if (*(uint *)&pAVar5->field_0x14 >> 0xc <= *(uint *)&pAVar3->field_0x14 >> 0xc) {
            __assert_fail("pFanin->Level > pObj->Level",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                          ,0x951,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
          }
          if (*(uint *)&pAVar5->field_0x14 >> 0xc == (*(uint *)&pAVar3->field_0x14 >> 0xc) + 1)
          break;
        }
        iVar1 = Abc_ObjFanoutNum(pAVar3);
        if (iVar1 <= nLevelMax) {
          for (nLevelMax = 0; iVar1 = Abc_ObjFaninNum(pAVar3), nLevelMax < iVar1;
              nLevelMax = nLevelMax + 1) {
            pAVar5 = Abc_ObjFanin(pAVar3,nLevelMax);
            iVar1 = Abc_NtkAddBuffsEval2(pAVar3,pAVar5);
            local_84 = local_84 - (uint)((iVar1 != 0 ^ 0xffU) & 1);
          }
          if (-1 < local_84) {
            *(uint *)&pAVar3->field_0x14 =
                 *(uint *)&pAVar3->field_0x14 & 0xfff |
                 ((*(uint *)&pAVar3->field_0x14 >> 0xc) + 1) * 0x1000;
            CountGain_1 = CountGain_1 + 1;
            local_80 = local_84 + local_80;
          }
        }
      }
      if (fVerbose != 0) {
        printf("Shifted %5d nodes up with total gain %5d.\n",(ulong)(uint)CountGain_1,
               (ulong)local_80);
      }
      if (CountGain_1 == 0) break;
    }
    Vec_PtrFree(pVVar4);
  }
  else {
    pVVar4 = Abc_NtkDfs(pNtk_00,1);
    if (0x3ffff < (int)nLevelMax_00) {
      __assert_fail("nLevelMax < (1<<18)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                    ,0x919,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
    }
    Iter = Vec_PtrSize(pVVar4);
    while (Iter = Iter + -1, -1 < Iter) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pVVar4,Iter);
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfff | 0x40000000;
      for (nLevelMax = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), nLevelMax < iVar1;
          nLevelMax = nLevelMax + 1) {
        pAVar5 = Abc_ObjFanout(pAVar3,nLevelMax);
        iVar1 = Abc_MinInt((*(uint *)&pAVar5->field_0x14 >> 0xc) - 1,
                           *(uint *)&pAVar3->field_0x14 >> 0xc);
        *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfff | iVar1 << 0xc;
      }
      if (*(uint *)&pAVar3->field_0x14 >> 0xc == 0) {
        __assert_fail("pObj->Level > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                      ,0x91f,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
      }
    }
    for (Iter = 0; iVar1 = Abc_NtkCiNum(pNtk_00), Iter < iVar1; Iter = Iter + 1) {
      pAVar3 = Abc_NtkCi(pNtk_00,Iter);
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfff;
    }
    for (vNodes._4_4_ = 0; vNodes._4_4_ < nImprove; vNodes._4_4_ = vNodes._4_4_ + 1) {
      CountGain = 0;
      local_68 = 0;
      for (Iter = 0; iVar1 = Vec_PtrSize(pVVar4), Iter < iVar1; Iter = Iter + 1) {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pVVar4,Iter);
        vNodes_1._4_4_ = -1;
        if (*(uint *)&pAVar3->field_0x14 >> 0xc == 0) {
          __assert_fail("pObj->Level > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                        ,0x92b,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
        }
        for (nLevelMax = 0; iVar1 = Abc_ObjFaninNum(pAVar3), nLevelMax < iVar1;
            nLevelMax = nLevelMax + 1) {
          pAVar5 = Abc_ObjFanin(pAVar3,nLevelMax);
          if (*(uint *)&pAVar3->field_0x14 >> 0xc <= *(uint *)&pAVar5->field_0x14 >> 0xc) {
            __assert_fail("pFanin->Level < pObj->Level",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                          ,0x92e,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
          }
          if ((*(uint *)&pAVar5->field_0x14 >> 0xc) + 1 == *(uint *)&pAVar3->field_0x14 >> 0xc)
          break;
        }
        iVar1 = Abc_ObjFaninNum(pAVar3);
        if (iVar1 <= nLevelMax) {
          for (nLevelMax = 0; iVar1 = Abc_ObjFaninNum(pAVar3), nLevelMax < iVar1;
              nLevelMax = nLevelMax + 1) {
            pAVar5 = Abc_ObjFanin(pAVar3,nLevelMax);
            iVar1 = Abc_NtkAddBuffsEval(pAVar3,pAVar5);
            vNodes_1._4_4_ = iVar1 + vNodes_1._4_4_;
          }
          if (-1 < vNodes_1._4_4_) {
            *(uint *)&pAVar3->field_0x14 =
                 *(uint *)&pAVar3->field_0x14 & 0xfff |
                 ((*(uint *)&pAVar3->field_0x14 >> 0xc) - 1) * 0x1000;
            CountGain = CountGain + 1;
            local_68 = vNodes_1._4_4_ + local_68;
          }
        }
      }
      if (fVerbose != 0) {
        printf("Shifted %5d nodes down with total gain %5d.\n",(ulong)(uint)CountGain,
               (ulong)local_68);
      }
      if (CountGain == 0) break;
    }
    Vec_PtrFree(pVVar4);
  }
  iVar1 = Abc_NtkObjNumMax(pNtk_00);
  pVVar4 = Vec_PtrStart(iVar1 * (nLevelMax_00 + 1));
  for (Iter = 0; iVar1 = Vec_PtrSize(pNtk_00->vObjs), Iter < iVar1; Iter = Iter + 1) {
    pAVar3 = Abc_NtkObj(pNtk_00,Iter);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      iVar1 = Vec_PtrSize(pVVar4);
      if (Iter == iVar1 / (int)(nLevelMax_00 + 1)) break;
      iVar1 = Abc_ObjIsNode(pAVar3);
      if ((iVar1 != 0) || (iVar1 = Abc_ObjIsCo(pAVar3), iVar1 != 0)) {
        for (nLevelMax = 0; iVar1 = Abc_ObjFaninNum(pAVar3), nLevelMax < iVar1;
            nLevelMax = nLevelMax + 1) {
          pAVar5 = Abc_ObjFanin(pAVar3,nLevelMax);
          iVar1 = Abc_ObjLevel(pAVar3);
          iVar2 = Abc_ObjLevel(pAVar5);
          if (iVar1 + -1 < iVar2) {
            __assert_fail("Abc_ObjLevel(pObj) - 1 >= Abc_ObjLevel(pFanin)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                          ,0x970,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
          }
          iVar1 = Abc_ObjLevel(pAVar3);
          iVar2 = Abc_ObjLevel(pAVar5);
          if (iVar1 + -1 != iVar2) {
            iVar1 = Abc_ObjLevel(pAVar3);
            pFaninNew = Abc_NtkAddBuffsOne(pVVar4,pAVar5,iVar1 + -1,nLevelMax_00);
            Abc_ObjPatchFanin(pAVar3,pAVar5,pFaninNew);
          }
        }
      }
    }
  }
  Vec_PtrFree(pVVar4);
  for (Iter = 0; iVar1 = Abc_NtkCoNum(pNtk_00), Iter < iVar1; Iter = Iter + 1) {
    pAVar3 = Abc_NtkCo(pNtk_00,Iter);
    *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfff;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkAddBuffsInt( Abc_Ntk_t * pNtkInit, int fReverse, int nImprove, int fVerbose )
{
    Vec_Ptr_t * vBuffs;
    Abc_Ntk_t * pNtk = Abc_NtkDup( pNtkInit );
    Abc_Obj_t * pObj, * pFanin, * pBuffer;
    int i, k, Iter, nLevelMax = Abc_NtkLevel( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->Level = nLevelMax + 1;
    if ( fReverse )
    {
        Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 1 );
        assert( nLevelMax < (1<<18) );
        Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
        {
            pObj->Level = (1<<18);
            Abc_ObjForEachFanout( pObj, pFanin, k )
                pObj->Level = Abc_MinInt( pFanin->Level - 1, pObj->Level );
            assert( pObj->Level > 0 );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->Level = 0;

        // move the nodes down one step at a time
        for ( Iter = 0; Iter < nImprove; Iter++ )
        {
            int Counter = 0, TotalGain = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            {
                int CountGain = -1;
                assert( pObj->Level > 0 );
                Abc_ObjForEachFanin( pObj, pFanin, k )
                {
                    assert( pFanin->Level < pObj->Level );
                    if ( pFanin->Level + 1 == pObj->Level )
                        break;
                }
                if ( k < Abc_ObjFaninNum(pObj) ) // cannot move
                    continue;
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    CountGain += Abc_NtkAddBuffsEval( pObj, pFanin );
                if ( CountGain >= 0 ) // can move
                {
                    pObj->Level--;
                    Counter++;
                    TotalGain += CountGain;
                }
            }
            if ( fVerbose )
                printf( "Shifted %5d nodes down with total gain %5d.\n", Counter, TotalGain );
            if ( Counter == 0 )
                break;
        }
        Vec_PtrFree( vNodes );
    }
    else
    {
        // move the nodes up one step at a time
        Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 1 );
        for ( Iter = 0; Iter < nImprove; Iter++ )
        {
            int Counter = 0, TotalGain = 0;
            Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
            {
                int CountGain = 1;
                assert( pObj->Level <= (unsigned)nLevelMax );
                Abc_ObjForEachFanout( pObj, pFanin, k )
                {
                    assert( pFanin->Level > pObj->Level );
                    if ( pFanin->Level == pObj->Level + 1 )
                        break;
                }
                if ( k < Abc_ObjFanoutNum(pObj) ) // cannot move
                    continue;
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    CountGain -= !Abc_NtkAddBuffsEval2( pObj, pFanin );
                if ( CountGain >= 0 ) // can move
                {
                    pObj->Level++;
                    Counter++;
                    TotalGain += CountGain;
                }
            } 
            if ( fVerbose )
                printf( "Shifted %5d nodes up with total gain %5d.\n", Counter, TotalGain );
            if ( Counter == 0 )
                break;
        }
        Vec_PtrFree( vNodes );
    }
    vBuffs = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) * (nLevelMax + 1) );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( i == Vec_PtrSize(vBuffs) / (nLevelMax + 1) )
            break;
        if ( !Abc_ObjIsNode(pObj) && !Abc_ObjIsCo(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( Abc_ObjLevel(pObj) - 1 >= Abc_ObjLevel(pFanin) );
            if ( Abc_ObjLevel(pObj) - 1 == Abc_ObjLevel(pFanin) )
                continue;
            pBuffer = Abc_NtkAddBuffsOne( vBuffs, pFanin, Abc_ObjLevel(pObj) - 1, nLevelMax );
            Abc_ObjPatchFanin( pObj, pFanin, pBuffer );
        }
    }
    Vec_PtrFree( vBuffs );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->Level = 0;
    return pNtk;
}